

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_zip.c
# Opt level: O2

void test_compat_zip_2(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *a;
  char *pcVar3;
  archive_entry *ae;
  char name [22];
  
  builtin_strncpy(name,"test_compat_zip_2.zip",0x16);
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                   ,L'T',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0)
  ;
  iVar1 = archive_read_support_filter_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'U',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  wVar2 = archive_read_support_format_zip(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'V',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_zip(a)",a);
  extract_reference_file(name);
  wVar2 = archive_read_open_filename(a,name,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'X',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 10240)",
                      a);
  iVar1 = archive_read_next_header(a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'[',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar3 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
             ,L'\\',"file1","\"file1\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  iVar1 = archive_read_next_header(a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'_',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar3 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
             ,L'`',"file2","\"file2\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  iVar1 = archive_read_next_header(a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'b',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'c',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'd',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_compat_zip_2)
{
	char name[] = "test_compat_zip_2.zip";
	struct archive_entry *ae;
	struct archive *a;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 10240));

	/* Read first entry. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("file1", archive_entry_pathname(ae));

	/* Read first entry. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("file2", archive_entry_pathname(ae));

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}